

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageColorTint(Image *image,Color color)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Image image_00;
  Color *pCVar4;
  uchar *puVar5;
  undefined8 unaff_RBP;
  long lVar6;
  ulong uVar7;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_RBP;
    image_00.data = (void *)unaff_R14;
    image_00._16_8_ = unaff_retaddr;
    pCVar4 = LoadImageColors(image_00);
    iVar2 = image->height;
    if (0 < (long)iVar2) {
      uVar3 = image->width;
      puVar5 = &pCVar4->a;
      lVar6 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar7 = 0;
          do {
            bVar1 = puVar5[uVar7 * 4];
            puVar5[uVar7 * 4 + -3] =
                 (uchar)(int)(((float)puVar5[uVar7 * 4 + -3] / 255.0) *
                              ((float)((uint)color & 0xff) / 255.0) * 255.0);
            puVar5[uVar7 * 4 + -2] =
                 (uchar)(int)(((float)puVar5[uVar7 * 4 + -2] / 255.0) *
                              ((float)((uint)color >> 8 & 0xff) / 255.0) * 255.0);
            puVar5[uVar7 * 4 + -1] =
                 (uchar)(int)(((float)puVar5[uVar7 * 4 + -1] / 255.0) *
                              ((float)((uint)color >> 0x10 & 0xff) / 255.0) * 255.0);
            puVar5[uVar7 * 4] =
                 (uchar)(int)(((float)bVar1 / 255.0) * ((float)((uint)color >> 0x18) / 255.0) *
                             255.0);
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        lVar6 = lVar6 + 1;
        puVar5 = puVar5 + (ulong)uVar3 * 4;
      } while (lVar6 != iVar2);
    }
    iVar2 = image->format;
    free(image->data);
    image->data = pCVar4;
    image->format = 7;
    ImageFormat(image,iVar2);
    return;
  }
  return;
}

Assistant:

void ImageColorTint(Image *image, Color color)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    float cR = (float)color.r/255;
    float cG = (float)color.g/255;
    float cB = (float)color.b/255;
    float cA = (float)color.a/255;

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int index = y*image->width + x;
            unsigned char r = (unsigned char)(((float)pixels[index].r/255*cR)*255.0f);
            unsigned char g = (unsigned char)(((float)pixels[index].g/255*cG)*255.0f);
            unsigned char b = (unsigned char)(((float)pixels[index].b/255*cB)*255.0f);
            unsigned char a = (unsigned char)(((float)pixels[index].a/255*cA)*255.0f);

            pixels[y*image->width + x].r = r;
            pixels[y*image->width + x].g = g;
            pixels[y*image->width + x].b = b;
            pixels[y*image->width + x].a = a;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}